

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapLookupIntKey(jx9_hashmap *pMap,sxi64 iKey,jx9_hashmap_node **ppNode)

{
  jx9_hashmap_node *pjVar1;
  sxu32 sVar2;
  jx9_hashmap_node **ppjVar3;
  
  if (pMap->nEntry != 0) {
    sVar2 = (*pMap->xIntHash)(iKey);
    ppjVar3 = pMap->apBucket + (pMap->nSize - 1 & sVar2);
    while (pjVar1 = *ppjVar3, pjVar1 != (jx9_hashmap_node *)0x0) {
      if (((pjVar1->iType == 1) && (pjVar1->nHash == sVar2)) && ((pjVar1->xKey).iKey == iKey)) {
        if (ppNode == (jx9_hashmap_node **)0x0) {
          return 0;
        }
        *ppNode = pjVar1;
        return 0;
      }
      ppjVar3 = &pjVar1->pNextCollide;
    }
  }
  return -6;
}

Assistant:

static sxi32 HashmapLookupIntKey(
	jx9_hashmap *pMap,         /* Target hashmap */
	sxi64 iKey,                /* lookup key */
	jx9_hashmap_node **ppNode  /* OUT: target node on success */
	)
{
	jx9_hashmap_node *pNode;
	sxu32 nHash;
	if( pMap->nEntry < 1 ){
		/* Don't bother hashing, there is no entry anyway */
		return SXERR_NOTFOUND;
	}
	/* Hash the key first */
	nHash = pMap->xIntHash(iKey);
	/* Point to the appropriate bucket */
	pNode = pMap->apBucket[nHash & (pMap->nSize - 1)];
	/* Perform the lookup */
	for(;;){
		if( pNode == 0 ){
			break;
		}
		if( pNode->iType == HASHMAP_INT_NODE
			&& pNode->nHash == nHash
			&& pNode->xKey.iKey == iKey ){
				/* Node found */
				if( ppNode ){
					*ppNode = pNode;
				}
				return SXRET_OK;
		}
		/* Follow the collision link */
		pNode = pNode->pNextCollide;
	}
	/* No such entry */
	return SXERR_NOTFOUND;
}